

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall IR::IRBuilder::save(IRBuilder *this,Temp *target)

{
  BasicBlock *this_00;
  bool bVar1;
  reference local_20;
  Temp *local_18;
  Temp *target_local;
  IRBuilder *this_local;
  
  local_18 = target;
  target_local = (Temp *)this;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::Save,std::allocator<IR::Save>>::emplace_front<IR::Temp_const*&>
              ((forward_list<IR::Save,std::allocator<IR::Save>> *)&this->function_->saves_,&local_18
              );
    this_00 = this->block_;
    local_20 = std::forward_list<IR::Save,_std::allocator<IR::Save>_>::front
                         (&this->function_->saves_);
    std::vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>::push_back
              (&this_00->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>,
               (value_type *)&local_20);
  }
  return;
}

Assistant:

void IRBuilder::save(const Temp* target) {
  if (block_->isTerminated()) return;
  function_->saves_.emplace_front(target);
  block_->push_back(&function_->saves_.front());
}